

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O3

FPlayerSoundHashTable * __thiscall
FPlayerSoundHashTable::operator=(FPlayerSoundHashTable *this,FPlayerSoundHashTable *other)

{
  Entry *pEVar1;
  int i;
  long lVar2;
  
  Free(this);
  lVar2 = 0;
  do {
    for (pEVar1 = other->Buckets[lVar2]; pEVar1 != (Entry *)0x0; pEVar1 = pEVar1->Next) {
      AddSound(this,pEVar1->PlayerSoundID,pEVar1->SfxID);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x17);
  return this;
}

Assistant:

FPlayerSoundHashTable &FPlayerSoundHashTable::operator= (const FPlayerSoundHashTable &other)
{
	Free ();
	for (int i = 0; i < NUM_BUCKETS; ++i)
	{
		Entry *entry;

		for (entry = other.Buckets[i]; entry != NULL; entry = entry->Next)
		{
			AddSound (entry->PlayerSoundID, entry->SfxID);
		}
	}
	return *this;
}